

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O2

enet_uint32 reflect_crc(int val,int bits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = 0;
  iVar3 = 0;
  if (0 < bits) {
    iVar3 = bits;
  }
  iVar2 = bits + -1;
  while( true ) {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    uVar1 = uVar1 | 1 << ((byte)iVar2 & 0x1f) & -(val & 1U);
    val = val >> 1;
    iVar2 = iVar2 + -1;
  }
  return uVar1;
}

Assistant:

static enet_uint32 
reflect_crc (int val, int bits)
{
    int result = 0, bit;

    for (bit = 0; bit < bits; bit ++)
    {
        if(val & 1) result |= 1 << (bits - 1 - bit); 
        val >>= 1;
    }

    return result;
}